

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O2

UBool icu_63::Transliterator::initializeRegistry(UErrorCode *status)

{
  undefined8 uVar1;
  undefined8 adoptedProto;
  int32_t iVar2;
  TransliteratorRegistry *pTVar3;
  Transliterator *adoptedProto_00;
  Transliterator *adoptedProto_01;
  Transliterator *this;
  Transliterator *pTVar4;
  NameUnicodeTransliterator *this_00;
  BreakTransliterator *this_01;
  UResourceBundle *resB;
  char *pcVar5;
  UResourceBundle *resB_00;
  UBool UVar6;
  UErrorCode *in_RSI;
  UnicodeString *text;
  uint indexR;
  bool visible;
  UChar type;
  int32_t len;
  UResourceBundle *local_1f8;
  undefined2 local_1ea;
  int32_t local_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 local_1d8;
  ConstChar16Ptr local_1d0;
  ConstChar16Ptr local_1c8;
  ConstChar16Ptr local_1c0;
  ConstChar16Ptr local_1b8;
  ConstChar16Ptr local_1b0;
  ConstChar16Ptr local_1a8;
  ConstChar16Ptr local_1a0;
  ConstChar16Ptr local_198;
  UnicodeString local_190;
  ConstChar16Ptr local_150;
  TransliteratorRegistry *local_148;
  char16_t *local_140;
  char16_t *local_138;
  char16_t *local_120;
  char16_t *local_118;
  char16_t *local_100;
  char16_t *local_f8;
  TransliteratorRegistry *local_e0;
  UChar *local_d0;
  char16_t *local_c0;
  UnicodeString id;
  UnicodeString T_PART;
  
  UVar6 = '\x01';
  if (registry == (TransliteratorRegistry *)0x0) {
    pTVar3 = (TransliteratorRegistry *)UMemory::operator_new((UMemory *)0x108,(size_t)in_RSI);
    if (pTVar3 == (TransliteratorRegistry *)0x0) {
      registry = (TransliteratorRegistry *)0x0;
    }
    else {
      in_RSI = status;
      TransliteratorRegistry::TransliteratorRegistry(pTVar3,status);
      registry = pTVar3;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        local_1d8 = ures_open_63("icudt63l-translit",(char *)0x0,status);
        local_1f8 = ures_getByKey_63((UResourceBundle *)local_1d8,"RuleBasedTransliteratorIDs",
                                     (UResourceBundle *)0x0,status);
        local_150.p_ = L"-t-";
        text = (UnicodeString *)0x1;
        icu_63::UnicodeString::UnicodeString(&T_PART,'\x01',&local_150,-1);
        local_c0 = local_150.p_;
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          iVar2 = ures_getSize_63(local_1f8);
          indexR = 0;
          if (iVar2 < 1) {
            iVar2 = 0;
          }
          local_1e8 = iVar2;
          for (; local_1e8 != indexR; indexR = indexR + 1) {
            text = (UnicodeString *)(ulong)indexR;
            resB = ures_getByIndex_63(local_1f8,indexR,(UResourceBundle *)0x0,status);
            if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
              pcVar5 = ures_getKey_63(resB);
              icu_63::UnicodeString::UnicodeString(&id,pcVar5,-1,kInvariant);
              text = &T_PART;
              iVar2 = icu_63::UnicodeString::indexOf(&id,text);
              if (iVar2 == -1) {
                resB_00 = ures_getNextResource_63(resB,(UResourceBundle *)0x0,status);
                pcVar5 = ures_getKey_63(resB_00);
                text = (UnicodeString *)&type;
                u_charsToUChars_63(pcVar5,(UChar *)text,1);
                if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                  len = 0;
                  if (type == L'a') {
                    local_1d0.p_ = ures_getString_63(resB_00,&len,status);
                    local_1e0 = registry;
                    icu_63::UnicodeString::UnicodeString(&local_190,'\x01',&local_1d0,len);
                    text = &id;
                    TransliteratorRegistry::put
                              ((TransliteratorRegistry *)local_1e0,&id,&local_190,'\x01','\x01',
                               status);
                    icu_63::UnicodeString::~UnicodeString(&local_190);
                    local_d0 = local_1d0.p_;
                  }
                  else if ((type == L'f') || (type == L'i')) {
                    local_1e0 = ures_getStringByKey_63(resB_00,"resource",&len,status);
                    visible = type == L'f';
                    ures_getUnicodeStringByKey(&local_190,resB_00,"direction",status);
                    local_1ea = icu_63::UnicodeString::doCharAt(&local_190,0);
                    icu_63::UnicodeString::~UnicodeString(&local_190);
                    local_148 = registry;
                    local_1c8.p_ = (char16_t *)local_1e0;
                    icu_63::UnicodeString::UnicodeString(&local_190,'\x01',&local_1c8,len);
                    text = &id;
                    TransliteratorRegistry::put
                              (local_148,&id,&local_190,(uint)(local_1ea != L'F'),'\x01',visible,
                               status);
                    icu_63::UnicodeString::~UnicodeString(&local_190);
                    local_e0 = (TransliteratorRegistry *)local_1c8.p_;
                  }
                }
                ures_close_63(resB_00);
              }
              else {
                ures_close_63(resB);
              }
              icu_63::UnicodeString::~UnicodeString(&id);
              if (iVar2 == -1) goto LAB_002716f0;
            }
            else {
LAB_002716f0:
              ures_close_63(resB);
            }
          }
        }
        ures_close_63(local_1f8);
        ures_close_63((UResourceBundle *)local_1d8);
        adoptedProto_00 = (Transliterator *)UMemory::operator_new((UMemory *)0x58,(size_t)text);
        if (adoptedProto_00 != (Transliterator *)0x0) {
          NullTransliterator::NullTransliterator((NullTransliterator *)adoptedProto_00);
        }
        adoptedProto_01 = (Transliterator *)UMemory::operator_new((UMemory *)0x60,(size_t)text);
        if (adoptedProto_01 != (Transliterator *)0x0) {
          LowercaseTransliterator::LowercaseTransliterator
                    ((LowercaseTransliterator *)adoptedProto_01);
        }
        this = (Transliterator *)UMemory::operator_new((UMemory *)0x60,(size_t)text);
        if (this != (Transliterator *)0x0) {
          UppercaseTransliterator::UppercaseTransliterator((UppercaseTransliterator *)this);
        }
        pTVar4 = (Transliterator *)UMemory::operator_new((UMemory *)0x60,(size_t)text);
        if (pTVar4 != (Transliterator *)0x0) {
          TitlecaseTransliterator::TitlecaseTransliterator((TitlecaseTransliterator *)pTVar4);
        }
        local_1d8 = pTVar4;
        pTVar4 = (Transliterator *)UMemory::operator_new((UMemory *)0x58,(size_t)text);
        if (pTVar4 != (Transliterator *)0x0) {
          text = (UnicodeString *)0x0;
          UnicodeNameTransliterator::UnicodeNameTransliterator
                    ((UnicodeNameTransliterator *)pTVar4,(UnicodeFilter *)0x0);
        }
        local_1f8 = (UResourceBundle *)this;
        this_00 = (NameUnicodeTransliterator *)UMemory::operator_new((UMemory *)0xb0,(size_t)text);
        if (this_00 != (NameUnicodeTransliterator *)0x0) {
          text = (UnicodeString *)0x0;
          NameUnicodeTransliterator::NameUnicodeTransliterator(this_00,(UnicodeFilter *)0x0);
        }
        this_01 = (BreakTransliterator *)UMemory::operator_new((UMemory *)0xa8,(size_t)text);
        if (this_01 != (BreakTransliterator *)0x0) {
          text = (UnicodeString *)0x0;
          BreakTransliterator::BreakTransliterator(this_01,(UnicodeFilter *)0x0);
        }
        adoptedProto = local_1d8;
        _local_1e8 = this_01;
        if ((((this_00 == (NameUnicodeTransliterator *)0x0) ||
             (adoptedProto_00 == (Transliterator *)0x0)) ||
            (adoptedProto_01 == (Transliterator *)0x0)) ||
           (((local_1f8 == (UResourceBundle *)0x0 ||
             ((Transliterator *)local_1d8 == (Transliterator *)0x0)) ||
            ((pTVar4 == (Transliterator *)0x0 || (this_01 == (BreakTransliterator *)0x0)))))) {
          if (adoptedProto_00 != (Transliterator *)0x0) {
            (*(adoptedProto_00->super_UObject)._vptr_UObject[1])(adoptedProto_00);
          }
          if (adoptedProto_01 != (Transliterator *)0x0) {
            (*(adoptedProto_01->super_UObject)._vptr_UObject[1])(adoptedProto_01);
          }
          if (local_1f8 != (UResourceBundle *)0x0) {
            (*(((CaseMapTransliterator *)&local_1f8->fKey)->super_Transliterator).super_UObject.
              _vptr_UObject[1])();
          }
          uVar1 = _local_1e8;
          if ((Transliterator *)adoptedProto != (Transliterator *)0x0) {
            (**(code **)(*(long *)adoptedProto + 8))(adoptedProto);
          }
          if (pTVar4 != (Transliterator *)0x0) {
            (*(pTVar4->super_UObject)._vptr_UObject[1])(pTVar4);
          }
          if (this_00 != (NameUnicodeTransliterator *)0x0) {
            (*(this_00->super_Transliterator).super_UObject._vptr_UObject[1])(this_00);
          }
          if ((BreakTransliterator *)uVar1 != (BreakTransliterator *)0x0) {
            (**(code **)(*(long *)uVar1 + 8))(uVar1);
          }
          pTVar3 = registry;
          if (registry != (TransliteratorRegistry *)0x0) {
            TransliteratorRegistry::~TransliteratorRegistry(registry);
          }
          UMemory::operator_delete((UMemory *)pTVar3,text);
          registry = (TransliteratorRegistry *)0x0;
          *status = U_MEMORY_ALLOCATION_ERROR;
          UVar6 = '\0';
        }
        else {
          TransliteratorRegistry::put(registry,adoptedProto_00,'\x01',status);
          TransliteratorRegistry::put(registry,adoptedProto_01,'\x01',status);
          TransliteratorRegistry::put(registry,(Transliterator *)local_1f8,'\x01',status);
          TransliteratorRegistry::put(registry,(Transliterator *)adoptedProto,'\x01',status);
          TransliteratorRegistry::put(registry,pTVar4,'\x01',status);
          TransliteratorRegistry::put(registry,(Transliterator *)this_00,'\x01',status);
          TransliteratorRegistry::put(registry,(Transliterator *)_local_1e8,'\0',status);
          RemoveTransliterator::registerIDs();
          EscapeTransliterator::registerIDs();
          UnescapeTransliterator::registerIDs();
          NormalizationTransliterator::registerIDs();
          AnyTransliterator::registerIDs();
          local_198.p_ = L"Null";
          icu_63::UnicodeString::UnicodeString(&id,'\x01',&local_198,-1);
          local_1a0.p_ = L"Null";
          icu_63::UnicodeString::UnicodeString(&local_190,'\x01',&local_1a0,-1);
          _registerSpecialInverse(&id,&local_190,'\0');
          icu_63::UnicodeString::~UnicodeString(&local_190);
          local_f8 = local_1a0.p_;
          icu_63::UnicodeString::~UnicodeString(&id);
          local_100 = local_198.p_;
          local_1a8.p_ = L"Upper";
          icu_63::UnicodeString::UnicodeString(&id,'\x01',&local_1a8,-1);
          local_1b0.p_ = L"Lower";
          icu_63::UnicodeString::UnicodeString(&local_190,'\x01',&local_1b0,-1);
          _registerSpecialInverse(&id,&local_190,'\x01');
          icu_63::UnicodeString::~UnicodeString(&local_190);
          local_118 = local_1b0.p_;
          icu_63::UnicodeString::~UnicodeString(&id);
          local_120 = local_1a8.p_;
          local_1b8.p_ = L"Title";
          icu_63::UnicodeString::UnicodeString(&id,'\x01',&local_1b8,-1);
          local_1c0.p_ = L"Lower";
          icu_63::UnicodeString::UnicodeString(&local_190,'\x01',&local_1c0,-1);
          _registerSpecialInverse(&id,&local_190,'\0');
          icu_63::UnicodeString::~UnicodeString(&local_190);
          local_138 = local_1c0.p_;
          icu_63::UnicodeString::~UnicodeString(&id);
          local_140 = local_1b8.p_;
          UVar6 = '\x01';
          ucln_i18n_registerCleanup_63(UCLN_I18N_TRANSLITERATOR,utrans_transliterator_cleanup_63);
        }
        icu_63::UnicodeString::~UnicodeString(&T_PART);
        return UVar6;
      }
      TransliteratorRegistry::~TransliteratorRegistry(pTVar3);
    }
    UMemory::operator_delete((UMemory *)pTVar3,in_RSI);
    registry = (TransliteratorRegistry *)0x0;
    UVar6 = '\0';
  }
  return UVar6;
}

Assistant:

UBool Transliterator::initializeRegistry(UErrorCode &status) {
    if (registry != 0) {
        return TRUE;
    }

    registry = new TransliteratorRegistry(status);
    if (registry == 0 || U_FAILURE(status)) {
        delete registry;
        registry = 0;
        return FALSE; // can't create registry, no recovery
    }

    /* The following code parses the index table located in
     * icu/data/translit/root.txt.  The index is an n x 4 table
     * that follows this format:
     *  <id>{
     *      file{
     *          resource{"<resource>"}
     *          direction{"<direction>"}
     *      }
     *  }
     *  <id>{
     *      internal{
     *          resource{"<resource>"}
     *          direction{"<direction"}
     *       }
     *  }
     *  <id>{
     *      alias{"<getInstanceArg"}
     *  }
     * <id> is the ID of the system transliterator being defined.  These
     * are public IDs enumerated by Transliterator.getAvailableIDs(),
     * unless the second field is "internal".
     * 
     * <resource> is a ResourceReader resource name.  Currently these refer
     * to file names under com/ibm/text/resources.  This string is passed
     * directly to ResourceReader, together with <encoding>.
     * 
     * <direction> is either "FORWARD" or "REVERSE".
     * 
     * <getInstanceArg> is a string to be passed directly to
     * Transliterator.getInstance().  The returned Transliterator object
     * then has its ID changed to <id> and is returned.
     *
     * The extra blank field on "alias" lines is to make the array square.
     */
    //static const char translit_index[] = "translit_index";

    UResourceBundle *bundle, *transIDs, *colBund;
    bundle = ures_open(U_ICUDATA_TRANSLIT, NULL/*open default locale*/, &status);
    transIDs = ures_getByKey(bundle, RB_RULE_BASED_IDS, 0, &status);
    const UnicodeString T_PART = UNICODE_STRING_SIMPLE("-t-");

    int32_t row, maxRows;
    if (U_SUCCESS(status)) {
        maxRows = ures_getSize(transIDs);
        for (row = 0; row < maxRows; row++) {
            colBund = ures_getByIndex(transIDs, row, 0, &status);
            if (U_SUCCESS(status)) {
                UnicodeString id(ures_getKey(colBund), -1, US_INV);
                if(id.indexOf(T_PART) != -1) {
                    ures_close(colBund);
                    continue;
                }
                UResourceBundle* res = ures_getNextResource(colBund, NULL, &status);
                const char* typeStr = ures_getKey(res);
                UChar type;
                u_charsToUChars(typeStr, &type, 1);

                if (U_SUCCESS(status)) {
                    int32_t len = 0;
                    const UChar *resString;
                    switch (type) {
                    case 0x66: // 'f'
                    case 0x69: // 'i'
                        // 'file' or 'internal';
                        // row[2]=resource, row[3]=direction
                        {
                            
                            resString = ures_getStringByKey(res, "resource", &len, &status);
                            UBool visible = (type == 0x0066 /*f*/);
                            UTransDirection dir = 
                                (ures_getUnicodeStringByKey(res, "direction", &status).charAt(0) ==
                                 0x0046 /*F*/) ?
                                UTRANS_FORWARD : UTRANS_REVERSE;
                            registry->put(id, UnicodeString(TRUE, resString, len), dir, TRUE, visible, status);
                        }
                        break;
                    case 0x61: // 'a'
                        // 'alias'; row[2]=createInstance argument
                        resString = ures_getString(res, &len, &status);
                        registry->put(id, UnicodeString(TRUE, resString, len), TRUE, TRUE, status);
                        break;
                    }
                }
                ures_close(res);
            }
            ures_close(colBund);
        }
    }

    ures_close(transIDs);
    ures_close(bundle);

    // Manually add prototypes that the system knows about to the
    // cache.  This is how new non-rule-based transliterators are
    // added to the system.
    
    // This is to allow for null pointer check
    NullTransliterator* tempNullTranslit = new NullTransliterator();
    LowercaseTransliterator* tempLowercaseTranslit = new LowercaseTransliterator();
    UppercaseTransliterator* tempUppercaseTranslit = new UppercaseTransliterator();
    TitlecaseTransliterator* tempTitlecaseTranslit = new TitlecaseTransliterator();
    UnicodeNameTransliterator* tempUnicodeTranslit = new UnicodeNameTransliterator();
    NameUnicodeTransliterator* tempNameUnicodeTranslit = new NameUnicodeTransliterator();
#if !UCONFIG_NO_BREAK_ITERATION
     // TODO: could or should these transliterators be referenced polymorphically once constructed?
     BreakTransliterator* tempBreakTranslit         = new BreakTransliterator();
#endif
    // Check for null pointers
    if (tempNullTranslit == NULL || tempLowercaseTranslit == NULL || tempUppercaseTranslit == NULL ||
        tempTitlecaseTranslit == NULL || tempUnicodeTranslit == NULL || 
#if !UCONFIG_NO_BREAK_ITERATION
        tempBreakTranslit == NULL ||
#endif
        tempNameUnicodeTranslit == NULL )
    {
        delete tempNullTranslit;
        delete tempLowercaseTranslit;
        delete tempUppercaseTranslit;
        delete tempTitlecaseTranslit;
        delete tempUnicodeTranslit;
        delete tempNameUnicodeTranslit;
#if !UCONFIG_NO_BREAK_ITERATION
        delete tempBreakTranslit;
#endif
        // Since there was an error, remove registry
        delete registry;
        registry = NULL;

        status = U_MEMORY_ALLOCATION_ERROR;
        return 0;
    }

    registry->put(tempNullTranslit, TRUE, status);
    registry->put(tempLowercaseTranslit, TRUE, status);
    registry->put(tempUppercaseTranslit, TRUE, status);
    registry->put(tempTitlecaseTranslit, TRUE, status);
    registry->put(tempUnicodeTranslit, TRUE, status);
    registry->put(tempNameUnicodeTranslit, TRUE, status);
#if !UCONFIG_NO_BREAK_ITERATION
    registry->put(tempBreakTranslit, FALSE, status);   // FALSE means invisible.
#endif

    RemoveTransliterator::registerIDs(); // Must be within mutex
    EscapeTransliterator::registerIDs();
    UnescapeTransliterator::registerIDs();
    NormalizationTransliterator::registerIDs();
    AnyTransliterator::registerIDs();

    _registerSpecialInverse(UNICODE_STRING_SIMPLE("Null"),
                            UNICODE_STRING_SIMPLE("Null"), FALSE);
    _registerSpecialInverse(UNICODE_STRING_SIMPLE("Upper"),
                            UNICODE_STRING_SIMPLE("Lower"), TRUE);
    _registerSpecialInverse(UNICODE_STRING_SIMPLE("Title"),
                            UNICODE_STRING_SIMPLE("Lower"), FALSE);

    ucln_i18n_registerCleanup(UCLN_I18N_TRANSLITERATOR, utrans_transliterator_cleanup);

    return TRUE;
}